

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3.h
# Opt level: O1

void ncnn::convdw3x3s1_sse(Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias,Option *opt)

{
  long lVar1;
  undefined4 uVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  void *pvVar7;
  void *pvVar8;
  void *pvVar9;
  size_t sVar10;
  size_t sVar11;
  void *pvVar12;
  size_t sVar13;
  size_t sVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  long lVar18;
  undefined1 auVar19 [16];
  uint *puVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  float *pfVar24;
  long lVar25;
  uint *puVar26;
  uint uVar27;
  float *pfVar28;
  uint *puVar29;
  int iVar30;
  uint *puVar31;
  undefined1 auVar32 [32];
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar44 [32];
  
  auVar19 = _DAT_00567980;
  iVar4 = bottom_blob->c;
  if (0 < (long)iVar4) {
    iVar5 = top_blob->w;
    uVar6 = top_blob->h;
    pvVar7 = _kernel->data;
    pvVar8 = _bias->data;
    lVar25 = (long)bottom_blob->w;
    pvVar9 = top_blob->data;
    sVar10 = top_blob->cstep;
    sVar11 = top_blob->elemsize;
    pvVar12 = bottom_blob->data;
    sVar13 = bottom_blob->cstep;
    sVar14 = bottom_blob->elemsize;
    lVar1 = lVar25 + 2;
    lVar23 = 0;
    do {
      if (pvVar8 == (void *)0x0) {
        fVar33 = 0.0;
      }
      else {
        fVar33 = *(float *)((long)pvVar8 + lVar23 * 4);
      }
      pfVar24 = (float *)(sVar10 * sVar11 * lVar23 + (long)pvVar9);
      puVar31 = (uint *)(sVar13 * sVar14 * lVar23 + (long)pvVar12);
      lVar18 = lVar23 * 0x24;
      puVar29 = puVar31 + lVar25;
      puVar20 = puVar31 + lVar25 * 2;
      uVar27 = 0;
      if (1 < (int)uVar6) {
        puVar26 = puVar31 + lVar25 * 3;
        pfVar28 = pfVar24;
        iVar21 = 0;
        do {
          pfVar28 = pfVar28 + iVar5;
          if (0 < iVar5) {
            lVar22 = 0;
            iVar30 = iVar5 + 1;
            do {
              auVar37 = *(undefined1 (*) [32])((long)pvVar7 + lVar18);
              auVar38._8_8_ = 0;
              auVar38._0_8_ = *(ulong *)((long)puVar31 + lVar22 + 4);
              auVar39 = vmovlhps_avx(ZEXT416(*(uint *)((long)puVar31 + lVar22)),auVar38);
              auVar39 = vshufps_avx(auVar39,auVar38,0xd8);
              auVar39 = vinsertps_avx(auVar39,ZEXT416(*(uint *)((long)puVar29 + lVar22)),0x30);
              uVar3 = *(ulong *)((long)puVar29 + lVar22 + 4);
              auVar41._8_8_ = 0;
              auVar41._0_8_ = uVar3;
              auVar43._16_8_ = uVar3;
              auVar43._0_16_ = auVar39;
              auVar43._24_8_ = 0;
              auVar45._8_8_ = 0;
              auVar45._0_8_ = *(ulong *)((long)puVar20 + lVar22);
              auVar32._16_8_ = *(ulong *)((long)puVar20 + lVar22);
              auVar32._0_16_ = auVar39;
              auVar32._24_8_ = 0;
              auVar32 = vshufpd_avx(auVar43,auVar32,2);
              auVar39._0_4_ = auVar37._0_4_ * auVar32._0_4_;
              auVar39._4_4_ = auVar37._4_4_ * auVar32._4_4_;
              auVar39._8_4_ = auVar37._8_4_ * auVar32._8_4_;
              auVar39._12_4_ = auVar37._12_4_ * auVar32._12_4_;
              auVar15._16_4_ = auVar37._16_4_ * auVar32._16_4_;
              auVar15._0_16_ = auVar39;
              auVar15._20_4_ = auVar37._20_4_ * auVar32._20_4_;
              auVar15._24_4_ = auVar37._24_4_ * auVar32._24_4_;
              auVar15._28_4_ = auVar32._28_4_;
              auVar39 = vhaddps_avx(auVar15._16_16_,auVar39);
              auVar39 = vhaddps_avx(auVar39,auVar39);
              auVar39 = vhaddps_avx(auVar39,auVar39);
              uVar2 = *(undefined4 *)((long)puVar20 + lVar22 + 8);
              auVar42._4_4_ = uVar2;
              auVar42._0_4_ = uVar2;
              auVar42._8_4_ = uVar2;
              auVar42._12_4_ = uVar2;
              auVar44._16_4_ = uVar2;
              auVar44._0_16_ = auVar42;
              auVar44._20_4_ = uVar2;
              auVar44._24_4_ = uVar2;
              auVar44._28_4_ = uVar2;
              auVar34 = vshufps_avx(auVar45,auVar41,0x41);
              auVar32 = vpermt2ps_avx512vl(ZEXT1632(auVar34),ZEXT1632(auVar19),auVar37);
              auVar46._16_8_ = *(undefined8 *)((long)puVar26 + lVar22);
              auVar46._0_16_ = auVar32._0_16_;
              auVar46._24_8_ = 0;
              auVar32 = vblendps_avx(auVar32,auVar44,0x20);
              auVar32 = vshufpd_avx(auVar32,auVar46,2);
              auVar37 = vblendps_avx(auVar37,ZEXT432(*(uint *)((long)puVar29 + lVar22)),1);
              auVar34._0_4_ = auVar32._0_4_ * auVar37._0_4_;
              auVar34._4_4_ = auVar32._4_4_ * auVar37._4_4_;
              auVar34._8_4_ = auVar32._8_4_ * auVar37._8_4_;
              auVar34._12_4_ = auVar32._12_4_ * auVar37._12_4_;
              auVar16._16_4_ = auVar32._16_4_ * auVar37._16_4_;
              auVar16._0_16_ = auVar34;
              auVar16._20_4_ = auVar32._20_4_ * auVar37._20_4_;
              auVar16._24_4_ = auVar32._24_4_ * auVar37._24_4_;
              auVar16._28_4_ = auVar37._28_4_;
              auVar34 = vhaddps_avx(auVar16._16_16_,auVar34);
              auVar41 = ZEXT416(*(uint *)((long)pvVar7 + lVar18 + 0x20));
              auVar38 = vfmadd231ss_fma(auVar39,auVar41,auVar42);
              auVar39 = vhaddps_avx(auVar34,auVar34);
              auVar39 = vhaddps_avx(auVar39,auVar39);
              auVar39 = vfmadd231ss_fma(auVar39,auVar41,
                                        ZEXT416(*(uint *)((long)puVar26 + lVar22 + 8)));
              *(float *)((long)pfVar24 + lVar22) = auVar38._0_4_ + fVar33;
              *(float *)((long)pfVar28 + lVar22) = auVar39._0_4_ + fVar33;
              lVar22 = lVar22 + 4;
              iVar30 = iVar30 + -1;
            } while (1 < iVar30);
            pfVar24 = (float *)((long)pfVar24 + lVar22);
            pfVar28 = (float *)((long)pfVar28 + lVar22);
            puVar31 = (uint *)((long)puVar31 + lVar22);
            puVar29 = (uint *)((long)puVar29 + lVar22);
            puVar20 = (uint *)((long)puVar20 + lVar22);
            puVar26 = (uint *)((long)puVar26 + lVar22);
          }
          puVar31 = puVar31 + lVar1;
          puVar29 = puVar29 + lVar1;
          puVar20 = puVar20 + lVar1;
          puVar26 = puVar26 + lVar1;
          pfVar24 = pfVar24 + iVar5;
          iVar30 = iVar21 + 3;
          iVar21 = iVar21 + 2;
          uVar27 = uVar6 & 0xfffffffe;
        } while (iVar30 < (int)uVar6);
      }
      if ((int)uVar27 < (int)uVar6) {
        do {
          iVar21 = iVar5 + 1;
          if (0 < iVar5) {
            do {
              auVar35._8_8_ = 0;
              auVar35._0_8_ = *(ulong *)(puVar31 + 1);
              auVar39 = vmovlhps_avx(ZEXT416(*puVar31),auVar35);
              auVar39 = vshufps_avx(auVar39,auVar35,0xd8);
              auVar39 = vinsertps_avx(auVar39,ZEXT416(*puVar29),0x30);
              puVar31 = puVar31 + 1;
              auVar40._16_8_ = *(undefined8 *)(puVar29 + 1);
              auVar40._0_16_ = auVar39;
              auVar40._24_8_ = 0;
              auVar37._16_8_ = *(undefined8 *)puVar20;
              auVar37._0_16_ = auVar39;
              auVar37._24_8_ = 0;
              auVar37 = vshufpd_avx(auVar40,auVar37,2);
              pfVar28 = (float *)((long)pvVar7 + lVar18);
              auVar36._0_4_ = auVar37._0_4_ * *pfVar28;
              auVar36._4_4_ = auVar37._4_4_ * pfVar28[1];
              auVar36._8_4_ = auVar37._8_4_ * pfVar28[2];
              auVar36._12_4_ = auVar37._12_4_ * pfVar28[3];
              auVar17._16_4_ = auVar37._16_4_ * pfVar28[4];
              auVar17._0_16_ = auVar36;
              auVar17._20_4_ = auVar37._20_4_ * pfVar28[5];
              auVar17._24_4_ = auVar37._24_4_ * pfVar28[6];
              auVar17._28_4_ = auVar37._28_4_;
              auVar39 = vhaddps_avx(auVar17._16_16_,auVar36);
              puVar29 = puVar29 + 1;
              auVar39 = vhaddps_avx(auVar39,auVar39);
              auVar39 = vhaddps_avx(auVar39,auVar39);
              auVar39 = vfmadd231ss_fma(auVar39,ZEXT416(*(uint *)((long)pvVar7 + lVar18 + 0x20)),
                                        ZEXT416(puVar20[2]));
              puVar20 = puVar20 + 1;
              *pfVar24 = auVar39._0_4_ + fVar33;
              pfVar24 = pfVar24 + 1;
              iVar21 = iVar21 + -1;
            } while (1 < iVar21);
          }
          puVar31 = puVar31 + 2;
          puVar29 = puVar29 + 2;
          puVar20 = puVar20 + 2;
          uVar27 = uVar27 + 1;
        } while (uVar27 != uVar6);
      }
      lVar23 = lVar23 + 1;
    } while (lVar23 != iVar4);
  }
  return;
}

Assistant:

static void convdw3x3s1_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& _kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int group = bottom_blob.c;

    const float* kernel = _kernel;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        Mat out = top_blob.channel(g);

        const float bias0 = bias ? bias[g] : 0.f;

        const float* kernel0 = kernel + g * 9;

        float* outptr = out;
        float* outptr2 = outptr + outw;

        const float* img0 = bottom_blob.channel(g);

        const float* r0 = img0;
        const float* r1 = img0 + w;
        const float* r2 = img0 + w * 2;
        const float* r3 = img0 + w * 3;

        const float* k0 = kernel0;
        const float* k1 = kernel0 + 3;
        const float* k2 = kernel0 + 6;

        int i = 0;

        for (; i + 1 < outh; i += 2)
        {
            int remain = outw;

            for (; remain > 0; remain--)
            {
                float sum = bias0;
                sum += r0[0] * k0[0];
                sum += r0[1] * k0[1];
                sum += r0[2] * k0[2];
                sum += r1[0] * k1[0];
                sum += r1[1] * k1[1];
                sum += r1[2] * k1[2];
                sum += r2[0] * k2[0];
                sum += r2[1] * k2[1];
                sum += r2[2] * k2[2];

                float sum2 = bias0;
                sum2 += r1[0] * k0[0];
                sum2 += r1[1] * k0[1];
                sum2 += r1[2] * k0[2];
                sum2 += r2[0] * k1[0];
                sum2 += r2[1] * k1[1];
                sum2 += r2[2] * k1[2];
                sum2 += r3[0] * k2[0];
                sum2 += r3[1] * k2[1];
                sum2 += r3[2] * k2[2];

                *outptr = sum;
                *outptr2 = sum2;

                r0++;
                r1++;
                r2++;
                r3++;
                outptr++;
                outptr2++;
            }

            r0 += 2 + w;
            r1 += 2 + w;
            r2 += 2 + w;
            r3 += 2 + w;

            outptr += outw;
            outptr2 += outw;
        }

        for (; i < outh; i++)
        {
            int remain = outw;

            for (; remain > 0; remain--)
            {
                float sum = bias0;
                sum += r0[0] * k0[0];
                sum += r0[1] * k0[1];
                sum += r0[2] * k0[2];
                sum += r1[0] * k1[0];
                sum += r1[1] * k1[1];
                sum += r1[2] * k1[2];
                sum += r2[0] * k2[0];
                sum += r2[1] * k2[1];
                sum += r2[2] * k2[2];

                *outptr = sum;

                r0++;
                r1++;
                r2++;
                outptr++;
            }

            r0 += 2;
            r1 += 2;
            r2 += 2;
        }
    }
}